

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_inv_var(secp256k1_fe *r,secp256k1_fe *x)

{
  int iVar1;
  secp256k1_fe *psVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  secp256k1_modinv64_modinfo *modinfo;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  secp256k1_modinv64_modinfo *extraout_RDX;
  secp256k1_modinv64_modinfo *extraout_RDX_00;
  secp256k1_modinv64_modinfo *extraout_RDX_01;
  secp256k1_modinv64_modinfo *extraout_RDX_02;
  secp256k1_modinv64_modinfo *modinfo_00;
  long *extraout_RDX_03;
  long lVar11;
  long lVar12;
  secp256k1_fe *psVar13;
  secp256k1_modinv64_modinfo *unaff_RBP;
  ulong uVar14;
  secp256k1_fe *psVar15;
  secp256k1_fe *a;
  secp256k1_fe *psVar16;
  secp256k1_sha256 *psVar17;
  secp256k1_fe *psVar18;
  uint64_t *puVar19;
  long lVar20;
  secp256k1_fe *psVar21;
  secp256k1_fe *psVar22;
  uint64_t uVar23;
  secp256k1_fe *psVar24;
  secp256k1_fe *psVar25;
  long lVar26;
  secp256k1_fe *psVar27;
  secp256k1_fe *psVar28;
  secp256k1_fe *psVar29;
  bool bVar30;
  byte bVar31;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_signed62 d;
  secp256k1_fe tmp;
  secp256k1_fe sStack_2b8;
  secp256k1_fe *psStack_288;
  secp256k1_sha256 *psStack_280;
  uchar auStack_274 [4];
  secp256k1_sha256 sStack_270;
  secp256k1_fe *psStack_208;
  secp256k1_fe *psStack_200;
  secp256k1_fe *psStack_1f8;
  int iStack_1ec;
  secp256k1_fe *psStack_1e8;
  long lStack_1e0;
  long lStack_1d8;
  long lStack_1d0;
  secp256k1_fe *psStack_1c8;
  secp256k1_fe *psStack_1c0;
  secp256k1_fe *psStack_1b8;
  secp256k1_fe *psStack_1b0;
  secp256k1_fe *psStack_1a8;
  secp256k1_fe *psStack_1a0;
  undefined8 uStack_198;
  secp256k1_fe *local_190;
  undefined1 local_188 [48];
  long local_158;
  ulong local_150;
  ulong local_148;
  secp256k1_fe *local_140;
  secp256k1_fe local_138;
  secp256k1_fe local_108;
  secp256k1_modinv64_trans2x2 local_d8;
  undefined1 local_b8 [48];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  secp256k1_fe local_68;
  
  bVar31 = 0;
  psVar28 = (secp256k1_fe *)0xf000000000000;
  psStack_1a0 = (secp256k1_fe *)0x11a050;
  local_140 = r;
  secp256k1_fe_verify(x);
  local_158 = 0x1000003d1;
  uVar5 = (x->n[4] >> 0x30) * 0x1000003d1 + x->n[0];
  uVar14 = (uVar5 >> 0x34) + x->n[1];
  uVar8 = (uVar14 >> 0x34) + x->n[2];
  uVar9 = (uVar8 >> 0x34) + x->n[3];
  uVar10 = (uVar9 >> 0x34) + (x->n[4] & 0xffffffffffff);
  local_148 = (uVar14 | uVar5 | uVar8 | uVar9) & 0xfffffffffffff | uVar10;
  local_150 = (uVar5 ^ 0x1000003d0) & uVar14 & uVar8 & uVar9 & (uVar10 ^ 0xf000000000000);
  psStack_1a0 = (secp256k1_fe *)0x11a0ca;
  secp256k1_fe_verify(x);
  local_68.n[0] = x->n[0];
  local_68.n[1] = x->n[1];
  local_68.n[2] = x->n[2];
  local_68.n[3] = x->n[3];
  local_68.n[4] = x->n[4];
  local_68.magnitude = x->magnitude;
  local_68.normalized = x->normalized;
  psVar13 = &local_68;
  psStack_1a0 = (secp256k1_fe *)0x11a0f9;
  local_188._40_8_ = x;
  secp256k1_fe_normalize_var(psVar13);
  local_138.n[0] = (local_68.n[1] << 0x34 | local_68.n[0]) & 0x3fffffffffffffff;
  local_138.n[1] = (ulong)((uint)local_68.n[2] & 0xfffff) << 0x2a | local_68.n[1] >> 10;
  local_138.n[2] = (ulong)((uint)local_68.n[3] & 0x3fffffff) << 0x20 | local_68.n[2] >> 0x14;
  local_138.n[3] = (local_68.n[4] & 0xffffffffff) << 0x16 | local_68.n[3] >> 0x1e;
  local_138.n[4] = local_68.n[4] >> 0x28;
  local_b8._16_8_ = 0;
  local_b8._24_8_ = 0;
  local_b8._0_8_ = 0;
  local_b8._8_8_ = 0;
  local_b8._32_8_ = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_b8._40_4_ = 1;
  local_b8._44_4_ = 0;
  local_188._16_8_ = 0;
  local_188._24_8_ = 0;
  local_188._0_8_ = -0x1000003d1;
  local_188._8_8_ = 0;
  local_188._32_8_ = 0x100;
  local_190 = (secp256k1_fe *)0x0;
  psVar27 = (secp256k1_fe *)0xffffffffffffffff;
  uStack_198._4_4_ = 5;
  local_108.n[0] = local_138.n[0];
  local_108.n[1] = local_138.n[1];
  local_108.n[2] = local_138.n[2];
  local_108.n[3] = local_138.n[3];
  local_108.n[4] = local_138.n[4];
LAB_0011a212:
  psVar25 = (secp256k1_fe *)local_188._0_8_;
  psVar2 = (secp256k1_fe *)0x0;
  psVar21 = (secp256k1_fe *)0x0;
  psVar18 = (secp256k1_fe *)0x1;
  uVar7 = 0x3e;
  psVar15 = (secp256k1_fe *)0x1;
  uVar23 = local_108.n[0];
  psVar22 = (secp256k1_fe *)local_188._0_8_;
  while( true ) {
    a = (secp256k1_fe *)(-1L << ((byte)uVar7 & 0x3f) | uVar23);
    modinfo = (secp256k1_modinv64_modinfo *)0x0;
    if (a != (secp256k1_fe *)0x0) {
      for (; ((ulong)a >> (long)modinfo & 1) == 0;
          modinfo = (secp256k1_modinv64_modinfo *)((long)(modinfo->modulus).v + 1)) {
      }
    }
    bVar3 = (byte)modinfo;
    psVar24 = (secp256k1_fe *)(uVar23 >> (bVar3 & 0x3f));
    psVar15 = (secp256k1_fe *)((long)psVar15 << (bVar3 & 0x3f));
    psVar2 = (secp256k1_fe *)((long)psVar2 << (bVar3 & 0x3f));
    psVar27 = (secp256k1_fe *)((long)psVar27 - (long)modinfo);
    uVar7 = uVar7 - (int)modinfo;
    if (uVar7 == 0) break;
    if (((ulong)psVar22 & 1) == 0) {
      psStack_1a0 = (secp256k1_fe *)0x11a7ab;
      secp256k1_fe_inv_var_cold_8();
LAB_0011a7ab:
      psStack_1a0 = (secp256k1_fe *)0x11a7b0;
      secp256k1_fe_inv_var_cold_7();
LAB_0011a7b0:
      psStack_1a0 = (secp256k1_fe *)0x11a7b5;
      secp256k1_fe_inv_var_cold_1();
LAB_0011a7b5:
      psStack_1a0 = (secp256k1_fe *)0x11a7ba;
      secp256k1_fe_inv_var_cold_2();
LAB_0011a7ba:
      psStack_1a0 = (secp256k1_fe *)0x11a7bf;
      secp256k1_fe_inv_var_cold_6();
      psVar24 = psVar22;
      goto LAB_0011a7bf;
    }
    if (((ulong)psVar24 & 1) == 0) goto LAB_0011a7ab;
    a = (secp256k1_fe *)((long)psVar2 * local_108.n[0] + (long)psVar15 * local_188._0_8_);
    modinfo = (secp256k1_modinv64_modinfo *)(ulong)(0x3e - uVar7);
    bVar3 = (byte)(0x3e - uVar7);
    psVar13 = (secp256k1_fe *)((long)psVar22 << (bVar3 & 0x3f));
    if (a != psVar13) goto LAB_0011a7b0;
    psVar13 = (secp256k1_fe *)((long)psVar18 * local_108.n[0] + (long)psVar21 * local_188._0_8_);
    a = (secp256k1_fe *)((long)psVar24 << (bVar3 & 0x3f));
    if (psVar13 != a) goto LAB_0011a7b5;
    modinfo = (secp256k1_modinv64_modinfo *)((long)psVar27[-0x10].n + 0x16);
    if (modinfo < (secp256k1_modinv64_modinfo *)0xfffffffffffffa2d) goto LAB_0011a7ba;
    iVar1 = (int)psVar24;
    if ((long)psVar27 < 0) {
      psVar27 = (secp256k1_fe *)-(long)psVar27;
      uVar4 = (int)psVar27 + 1;
      if ((int)uVar7 <= (int)uVar4) {
        uVar4 = uVar7;
      }
      modinfo = (secp256k1_modinv64_modinfo *)(ulong)uVar4;
      a = (secp256k1_fe *)(ulong)(uVar4 - 0x3f);
      if (0xffffffc1 < uVar4 - 0x3f) {
        psVar29 = (secp256k1_fe *)-(long)psVar2;
        unaff_RBP = (secp256k1_modinv64_modinfo *)-(long)psVar15;
        psVar16 = (secp256k1_fe *)-(long)psVar22;
        psVar13 = (secp256k1_fe *)
                  ((ulong)(0x3fL << (-(char)uVar4 & 0x3fU)) >> (-(char)uVar4 & 0x3fU));
        uVar4 = (iVar1 * iVar1 + 0x3e) * iVar1 * (int)psVar16 & (uint)psVar13;
        psVar2 = psVar18;
        psVar15 = psVar21;
        psVar28 = psVar29;
        goto LAB_0011a36c;
      }
      goto LAB_0011a7c9;
    }
    uVar4 = (int)psVar27 + 1;
    if ((int)uVar7 <= (int)uVar4) {
      uVar4 = uVar7;
    }
    modinfo = (secp256k1_modinv64_modinfo *)(ulong)uVar4;
    a = (secp256k1_fe *)(ulong)(uVar4 - 0x3f);
    if (uVar4 - 0x3f < 0xffffffc2) goto LAB_0011a7c4;
    psVar13 = (secp256k1_fe *)((ulong)(0xfL << (-(char)uVar4 & 0x3fU)) >> (-(char)uVar4 & 0x3fU));
    uVar4 = -(iVar1 * (((int)psVar22 * 2 + 2U & 8) + (int)psVar22)) & (uint)psVar13;
    unaff_RBP = (secp256k1_modinv64_modinfo *)psVar21;
    psVar29 = psVar18;
    psVar16 = psVar24;
    psVar24 = psVar22;
LAB_0011a36c:
    uVar5 = (ulong)uVar4;
    a = (secp256k1_fe *)(uVar5 * (long)psVar24);
    uVar23 = (long)a->n + (long)psVar16->n;
    psVar21 = (secp256k1_fe *)((long)((secp256k1_fe *)unaff_RBP)->n + (long)psVar15 * uVar5);
    modinfo = (secp256k1_modinv64_modinfo *)(uVar5 * (long)psVar2);
    psVar18 = (secp256k1_fe *)((long)(modinfo->modulus).v + (long)psVar29->n);
    psVar22 = psVar24;
    if ((uVar23 & (ulong)psVar13) != 0) {
LAB_0011a7bf:
      psStack_1a0 = (secp256k1_fe *)0x11a7c4;
      secp256k1_fe_inv_var_cold_4();
      psVar22 = psVar24;
LAB_0011a7c4:
      psStack_1a0 = (secp256k1_fe *)0x11a7c9;
      secp256k1_fe_inv_var_cold_3();
LAB_0011a7c9:
      psStack_1a0 = (secp256k1_fe *)0x11a7ce;
      secp256k1_fe_inv_var_cold_5();
      goto LAB_0011a7ce;
    }
  }
  a = (secp256k1_fe *)((long)psVar2 * (long)psVar21);
  modinfo = SUB168(SEXT816((long)psVar2) * SEXT816((long)psVar21),8);
  psStack_1c0 = (secp256k1_fe *)local_188._0_8_;
  local_d8.u = (int64_t)psVar15;
  local_d8.v = (int64_t)psVar2;
  local_d8.q = (int64_t)psVar21;
  local_d8.r = (int64_t)psVar18;
  if ((long)psVar15 * (long)psVar18 - (long)a != 0x4000000000000000 ||
      SUB168(SEXT816((long)psVar15) * SEXT816((long)psVar18),8) - (long)modinfo !=
      (ulong)((secp256k1_fe *)((long)psVar15 * (long)psVar18) < a)) goto LAB_0011a80a;
  psStack_1a0 = (secp256k1_fe *)0x11a3f2;
  secp256k1_modinv64_update_de_62
            ((secp256k1_modinv64_signed62 *)local_b8,
             (secp256k1_modinv64_signed62 *)(local_b8 + 0x28),&local_d8,modinfo);
  uVar7 = uStack_198._4_4_;
  psVar28 = (secp256k1_fe *)local_188;
  psVar13 = (secp256k1_fe *)(ulong)uStack_198._4_4_;
  psVar15 = (secp256k1_fe *)(ulong)uStack_198._4_4_;
  unaff_RBP = &secp256k1_const_modinfo_fe;
  modinfo = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
  psStack_1a0 = (secp256k1_fe *)0x11a416;
  a = psVar28;
  iVar1 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)psVar28,uStack_198._4_4_,
                     &secp256k1_const_modinfo_fe.modulus,-1);
  psVar22 = local_190;
  psVar25 = &local_108;
  if (0 < iVar1) {
    modinfo = (secp256k1_modinv64_modinfo *)0x1;
    psVar15 = (secp256k1_fe *)(ulong)uVar7;
    psStack_1a0 = (secp256k1_fe *)0x11a43d;
    a = psVar28;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar28,uVar7,
                       &secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar1) goto LAB_0011a7d3;
    psVar15 = (secp256k1_fe *)(ulong)uVar7;
    modinfo = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
    psStack_1a0 = (secp256k1_fe *)0x11a459;
    a = psVar25;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar25,uVar7,
                       &secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar1 < 1) goto LAB_0011a7d8;
    modinfo = (secp256k1_modinv64_modinfo *)0x1;
    psVar15 = (secp256k1_fe *)(ulong)uVar7;
    psStack_1a0 = (secp256k1_fe *)0x11a473;
    a = psVar25;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar25,uVar7,
                       &secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar1) goto LAB_0011a7dd;
    psStack_1a0 = (secp256k1_fe *)0x11a490;
    secp256k1_modinv64_update_fg_62_var
              (uVar7,(secp256k1_modinv64_signed62 *)psVar28,(secp256k1_modinv64_signed62 *)psVar25,
               &local_d8);
    if (local_108.n[0] == 0) {
      if (1 < (int)uVar7) {
        uVar5 = 1;
        uVar8 = 0;
        do {
          uVar8 = uVar8 | local_108.n[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar7 != uVar5);
        if (uVar8 != 0) goto LAB_0011a4c6;
      }
      a = &local_108;
      psVar15 = (secp256k1_fe *)(ulong)uVar7;
      modinfo = (secp256k1_modinv64_modinfo *)0x0;
      psStack_1a0 = (secp256k1_fe *)0x11a5bb;
      iVar1 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a,uVar7,&SECP256K1_SIGNED62_ONE,0);
      if (iVar1 != 0) goto LAB_0011a7fb;
      psStack_1a0 = (secp256k1_fe *)0x11a5dd;
      iVar1 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)local_188,uVar7,&SECP256K1_SIGNED62_ONE,-1);
      modinfo_00 = extraout_RDX;
      if (iVar1 != 0) {
        psStack_1a0 = (secp256k1_fe *)0x11a5fd;
        iVar1 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)local_188,uVar7,&SECP256K1_SIGNED62_ONE,1)
        ;
        modinfo_00 = extraout_RDX_00;
        if (iVar1 != 0) {
          a = &local_138;
          psVar15 = (secp256k1_fe *)0x5;
          modinfo = (secp256k1_modinv64_modinfo *)0x0;
          psStack_1a0 = (secp256k1_fe *)0x11a61d;
          iVar1 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)a,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar1 != 0) goto LAB_0011a805;
          a = (secp256k1_fe *)local_b8;
          psVar15 = (secp256k1_fe *)0x5;
          modinfo = (secp256k1_modinv64_modinfo *)0x0;
          psStack_1a0 = (secp256k1_fe *)0x11a640;
          iVar1 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)a,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar1 != 0) goto LAB_0011a805;
          psStack_1a0 = (secp256k1_fe *)0x11a660;
          iVar1 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)local_188,uVar7,
                             &secp256k1_const_modinfo_fe.modulus,1);
          modinfo_00 = extraout_RDX_01;
          if (iVar1 != 0) {
            a = (secp256k1_fe *)local_188;
            psVar15 = (secp256k1_fe *)(ulong)uVar7;
            modinfo = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
            psStack_1a0 = (secp256k1_fe *)0x11a67e;
            iVar1 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)a,uVar7,
                               &secp256k1_const_modinfo_fe.modulus,-1);
            modinfo_00 = extraout_RDX_02;
            if (iVar1 != 0) goto LAB_0011a805;
          }
        }
      }
      psStack_1a0 = (secp256k1_fe *)0x11a69e;
      secp256k1_modinv64_normalize_62
                ((secp256k1_modinv64_signed62 *)local_b8,(int64_t)(&local_190)[(int)uVar7],
                 modinfo_00);
      psVar13 = local_140;
      local_138.n[4] = local_b8._32_8_;
      local_138.n[2] = local_b8._16_8_;
      local_138.n[3] = local_b8._24_8_;
      local_138.n[0] = local_b8._0_8_;
      local_138.n[1] = local_b8._8_8_;
      psStack_1a0 = (secp256k1_fe *)0x11a6c6;
      secp256k1_fe_from_signed62(local_140,(secp256k1_modinv64_signed62 *)&local_138);
      psVar13->magnitude = (uint)(0 < *(int *)(local_188._40_8_ + 0x28));
      psVar13->normalized = 1;
      psStack_1a0 = (secp256k1_fe *)0x11a6e6;
      secp256k1_fe_verify(psVar13);
      uVar8 = (psVar13->n[4] >> 0x30) * local_158 + psVar13->n[0];
      uVar5 = (uVar8 >> 0x34) + psVar13->n[1];
      uVar9 = (uVar5 >> 0x34) + psVar13->n[2];
      uVar10 = (uVar9 >> 0x34) + psVar13->n[3];
      psVar15 = (secp256k1_fe *)((uVar10 >> 0x34) + (psVar13->n[4] & 0xffffffffffff));
      a = (secp256k1_fe *)
          ((uVar8 ^ 0x1000003d0) & uVar5 & uVar9 & uVar10 & ((ulong)psVar15 ^ 0xf000000000000));
      bVar30 = a == (secp256k1_fe *)0xfffffffffffff ||
               ((uVar5 | uVar8 | uVar9 | uVar10) & 0xfffffffffffff) == 0 &&
               psVar15 == (secp256k1_fe *)0x0;
      modinfo = (secp256k1_modinv64_modinfo *)
                CONCAT71((int7)(((ulong)psVar15 ^ 0xf000000000000) >> 8),bVar30);
      if ((local_150 != 0xfffffffffffff && local_148 != 0) != bVar30) {
        secp256k1_fe_verify(psVar13);
        return;
      }
      goto LAB_0011a800;
    }
LAB_0011a4c6:
    lVar6 = (long)(int)uVar7;
    psVar2 = (&local_190)[lVar6];
    modinfo = (secp256k1_modinv64_modinfo *)local_138.n[lVar6 + 5];
    a = (secp256k1_fe *)((long)psVar2 >> 0x3f ^ (ulong)psVar2 | lVar6 + -2 >> 0x3f);
    psVar15 = (secp256k1_fe *)((long)modinfo >> 0x3f ^ (ulong)modinfo | (ulong)a);
    if (psVar15 == (secp256k1_fe *)0x0) {
      psVar13 = (secp256k1_fe *)(ulong)(uVar7 - 1);
      (&uStack_198)[lVar6] = (&uStack_198)[lVar6] | (long)psVar2 << 0x3e;
      modinfo = (secp256k1_modinv64_modinfo *)((long)modinfo << 0x3e);
      local_138.n[lVar6 + 4] = local_138.n[lVar6 + 4] | (ulong)modinfo;
    }
    if ((int)psVar22 == 0xb) goto LAB_0011a7e2;
    uVar7 = (uint)psVar13;
    unaff_RBP = &secp256k1_const_modinfo_fe;
    modinfo = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
    psStack_1a0 = (secp256k1_fe *)0x11a535;
    psVar15 = psVar13;
    a = psVar28;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar28,uVar7,
                       &secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar1 < 1) goto LAB_0011a7e7;
    modinfo = (secp256k1_modinv64_modinfo *)0x1;
    psStack_1a0 = (secp256k1_fe *)0x11a54f;
    psVar15 = psVar13;
    a = psVar28;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar28,uVar7,
                       &secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar1) goto LAB_0011a7ec;
    modinfo = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
    psStack_1a0 = (secp256k1_fe *)0x11a56b;
    psVar15 = psVar13;
    a = psVar25;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar25,uVar7,
                       &secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar1 < 1) goto LAB_0011a7f1;
    modinfo = (secp256k1_modinv64_modinfo *)0x1;
    psStack_1a0 = (secp256k1_fe *)0x11a585;
    psVar15 = psVar13;
    a = psVar25;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar25,uVar7,
                       &secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar1) goto LAB_0011a7f6;
    local_190 = (secp256k1_fe *)(ulong)((int)psVar22 + 1);
    uStack_198._4_4_ = uVar7;
    goto LAB_0011a212;
  }
LAB_0011a7ce:
  psStack_1a0 = (secp256k1_fe *)0x11a7d3;
  secp256k1_fe_inv_var_cold_21();
LAB_0011a7d3:
  psStack_1a0 = (secp256k1_fe *)0x11a7d8;
  secp256k1_fe_inv_var_cold_20();
LAB_0011a7d8:
  psStack_1a0 = (secp256k1_fe *)0x11a7dd;
  secp256k1_fe_inv_var_cold_19();
LAB_0011a7dd:
  psStack_1a0 = (secp256k1_fe *)0x11a7e2;
  secp256k1_fe_inv_var_cold_18();
LAB_0011a7e2:
  psStack_1a0 = (secp256k1_fe *)0x11a7e7;
  secp256k1_fe_inv_var_cold_14();
LAB_0011a7e7:
  psStack_1a0 = (secp256k1_fe *)0x11a7ec;
  secp256k1_fe_inv_var_cold_13();
LAB_0011a7ec:
  psStack_1a0 = (secp256k1_fe *)0x11a7f1;
  secp256k1_fe_inv_var_cold_12();
LAB_0011a7f1:
  psStack_1a0 = (secp256k1_fe *)0x11a7f6;
  secp256k1_fe_inv_var_cold_11();
LAB_0011a7f6:
  psStack_1a0 = (secp256k1_fe *)0x11a7fb;
  secp256k1_fe_inv_var_cold_10();
LAB_0011a7fb:
  psStack_1a0 = (secp256k1_fe *)0x11a800;
  secp256k1_fe_inv_var_cold_15();
LAB_0011a800:
  psStack_1a0 = (secp256k1_fe *)0x11a805;
  secp256k1_fe_inv_var_cold_17();
LAB_0011a805:
  psStack_1a0 = (secp256k1_fe *)0x11a80a;
  secp256k1_fe_inv_var_cold_16();
  psStack_1c0 = psVar25;
LAB_0011a80a:
  psStack_1a0 = (secp256k1_fe *)secp256k1_modinv64_update_fg_62_var;
  secp256k1_fe_inv_var_cold_9();
  iVar1 = (int)a;
  psStack_1c8 = psVar13;
  psStack_1b8 = psVar22;
  psStack_1b0 = psVar27;
  psStack_1a8 = psVar28;
  psStack_1a0 = (secp256k1_fe *)unaff_RBP;
  if (iVar1 < 1) {
LAB_0011aab7:
    psStack_1f8 = (secp256k1_fe *)0x11aabc;
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_0011aabc:
    psStack_1f8 = (secp256k1_fe *)0x11aac1;
    secp256k1_modinv64_update_fg_62_var_cold_1();
    psVar22 = psVar27;
LAB_0011aac1:
    psStack_1f8 = (secp256k1_fe *)0x11aac6;
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_0011aac6:
    psStack_1f8 = (secp256k1_fe *)0x11aacb;
    secp256k1_modinv64_update_fg_62_var_cold_6();
LAB_0011aacb:
    psStack_1f8 = (secp256k1_fe *)0x11aad0;
    secp256k1_modinv64_update_fg_62_var_cold_5();
    psVar27 = psVar22;
    psVar25 = psVar28;
  }
  else {
    lStack_1d0 = (modinfo->modulus).v[0];
    lStack_1d8 = (modinfo->modulus).v[1];
    uVar23 = psVar15->n[0];
    lVar6 = *extraout_RDX_03;
    psVar27 = (secp256k1_fe *)(uVar23 * lStack_1d0);
    lVar11 = SUB168(SEXT816((long)uVar23) * SEXT816(lStack_1d0),8);
    uVar8 = lVar6 * lStack_1d8;
    psVar13 = SUB168(SEXT816(lVar6) * SEXT816(lStack_1d8),8);
    uVar5 = (ulong)((secp256k1_fe *)~uVar8 < psVar27);
    lVar12 = (0x7fffffffffffffff - (long)psVar13) - lVar11;
    psVar25 = (secp256k1_fe *)~uVar8;
    if ((SBORROW8(0x7fffffffffffffff - (long)psVar13,lVar11) != SBORROW8(lVar12,uVar5)) ==
        (long)(lVar12 - uVar5) < 0 || (long)psVar13 < 0) {
      lStack_1e0 = (modinfo->modulus).v[2];
      psVar25 = (secp256k1_fe *)(modinfo->modulus).v[3];
      puVar19 = (uint64_t *)((long)psVar27->n + uVar8);
      psVar13 = (secp256k1_fe *)((long)psVar13->n + (ulong)CARRY8(uVar8,(ulong)psVar27) + lVar11);
      uVar8 = uVar23 * lStack_1e0;
      psVar27 = SUB168(SEXT816((long)uVar23) * SEXT816(lStack_1e0),8);
      uVar9 = lVar6 * (long)psVar25;
      lVar12 = SUB168(SEXT816(lVar6) * SEXT816((long)psVar25),8);
      uVar5 = (ulong)(-uVar9 - 1 < uVar8);
      lVar6 = (0x7fffffffffffffff - lVar12) - (long)psVar27;
      psStack_1e8 = psVar25;
      if ((SBORROW8(0x7fffffffffffffff - lVar12,(long)psVar27) != SBORROW8(lVar6,uVar5)) !=
          (long)(lVar6 - uVar5) < 0 && -1 < lVar12) goto LAB_0011aad5;
      lVar6 = (long)psVar27->n + (ulong)CARRY8(uVar9,uVar8) + lVar12;
      psVar28 = psVar25;
      if (((ulong)puVar19 & 0x3fffffffffffffff) != 0) goto LAB_0011aabc;
      psVar22 = psVar27;
      if ((uVar9 + uVar8 & 0x3fffffffffffffff) != 0) goto LAB_0011aac1;
      uVar5 = uVar9 + uVar8 >> 0x3e | lVar6 * 4;
      uVar8 = (ulong)puVar19 >> 0x3e | (long)psVar13 * 4;
      psVar22 = (secp256k1_fe *)(lVar6 >> 0x3e);
      psVar13 = (secp256k1_fe *)((long)psVar13 >> 0x3e);
      iStack_1ec = iVar1;
      if (iVar1 != 1) {
        a = (secp256k1_fe *)((ulong)a & 0xffffffff);
        psVar2 = (secp256k1_fe *)0x1;
        do {
          psVar27 = (secp256k1_fe *)psVar15->n[(long)psVar2];
          psVar28 = (secp256k1_fe *)((long)psVar27 * lStack_1d0 + uVar8);
          lVar11 = (long)psVar13->n +
                   (ulong)CARRY8((long)psVar27 * lStack_1d0,uVar8) +
                   SUB168(SEXT816((long)psVar27) * SEXT816(lStack_1d0),8);
          lVar6 = extraout_RDX_03[(long)psVar2];
          uVar8 = lVar6 * lStack_1d8;
          lVar12 = SUB168(SEXT816(lVar6) * SEXT816(lStack_1d8),8);
          if (-1 < lVar12) {
            psVar13 = (secp256k1_fe *)(-1 - uVar8);
            lVar20 = (0x7fffffffffffffff - lVar12) - lVar11;
            if ((SBORROW8(0x7fffffffffffffff - lVar12,lVar11) !=
                SBORROW8(lVar20,(ulong)(psVar13 < psVar28))) ==
                (long)(lVar20 - (ulong)(psVar13 < psVar28)) < 0) goto LAB_0011a9a6;
LAB_0011aaad:
            psStack_1f8 = (secp256k1_fe *)0x11aab2;
            secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_0011aab2:
            psStack_1f8 = (secp256k1_fe *)0x11aab7;
            secp256k1_modinv64_update_fg_62_var_cold_3();
            goto LAB_0011aab7;
          }
          lVar26 = (-0x8000000000000000 - lVar12) - (ulong)(uVar8 != 0);
          lVar20 = lVar11 - lVar26;
          psVar13 = (secp256k1_fe *)(lVar20 - (ulong)(psVar28 < (secp256k1_fe *)-uVar8));
          if ((SBORROW8(lVar11,lVar26) != SBORROW8(lVar20,(ulong)(psVar28 < (secp256k1_fe *)-uVar8))
              ) != (long)psVar13 < 0) goto LAB_0011aaad;
LAB_0011a9a6:
          bVar30 = CARRY8((ulong)psVar28,uVar8);
          psVar28 = (secp256k1_fe *)((long)psVar28->n + uVar8);
          lVar12 = lVar11 + lVar12 + (ulong)bVar30;
          psVar13 = (secp256k1_fe *)((long)psVar27 * lStack_1e0 + uVar5);
          psVar27 = (secp256k1_fe *)
                    ((long)psVar22->n +
                    (ulong)CARRY8((long)psVar27 * lStack_1e0,uVar5) +
                    SUB168(SEXT816((long)psVar27) * SEXT816(lStack_1e0),8));
          uVar5 = lVar6 * (long)psVar25;
          lVar6 = SUB168(SEXT816(lVar6) * SEXT816((long)psVar25),8);
          if (lVar6 < 0) {
            lVar20 = (-0x8000000000000000 - lVar6) - (ulong)(uVar5 != 0);
            lVar11 = (long)psVar27 - lVar20;
            if ((SBORROW8((long)psVar27,lVar20) !=
                SBORROW8(lVar11,(ulong)(psVar13 < (secp256k1_fe *)-uVar5))) !=
                (long)(lVar11 - (ulong)(psVar13 < (secp256k1_fe *)-uVar5)) < 0) goto LAB_0011aab2;
          }
          else {
            uVar8 = (ulong)((secp256k1_fe *)(-1 - uVar5) < psVar13);
            lVar11 = (0x7fffffffffffffff - lVar6) - (long)psVar27;
            if ((SBORROW8(0x7fffffffffffffff - lVar6,(long)psVar27) != SBORROW8(lVar11,uVar8)) !=
                (long)(lVar11 - uVar8) < 0) goto LAB_0011aab2;
          }
          puVar19 = (uint64_t *)((long)psVar13->n + uVar5);
          lVar6 = (long)psVar27->n + (ulong)CARRY8((ulong)psVar13,uVar5) + lVar6;
          uVar8 = lVar12 * 4 | (ulong)psVar28 >> 0x3e;
          psVar15->n[(long)((long)&psVar2[-1].normalized + 3)] =
               (uint64_t)((ulong)psVar28 & 0x3fffffffffffffff);
          uVar5 = lVar6 * 4 | (ulong)puVar19 >> 0x3e;
          extraout_RDX_03[(long)((long)&psVar2[-1].normalized + 3)] =
               (ulong)puVar19 & 0x3fffffffffffffff;
          psVar2 = (secp256k1_fe *)((long)psVar2->n + 1);
          psVar22 = (secp256k1_fe *)(lVar6 >> 0x3e);
          psVar13 = (secp256k1_fe *)(lVar12 >> 0x3e);
          psVar28 = (secp256k1_fe *)((ulong)psVar28 & 0x3fffffffffffffff);
        } while (a != psVar2);
      }
      if ((long)psVar13->n + ((ulong)(0x7fffffffffffffff < uVar8) - 1) != -1) goto LAB_0011aac6;
      psVar15->n[(long)iVar1 + -1] = uVar8;
      psVar22 = (secp256k1_fe *)((long)psVar22->n + ((ulong)(0x7fffffffffffffff < uVar5) - 1));
      if (psVar22 == (secp256k1_fe *)0xffffffffffffffff) {
        extraout_RDX_03[(long)iVar1 + -1] = uVar5;
        return;
      }
      goto LAB_0011aacb;
    }
  }
  psStack_1f8 = (secp256k1_fe *)0x11aad5;
  secp256k1_modinv64_update_fg_62_var_cold_8();
LAB_0011aad5:
  psStack_1f8 = (secp256k1_fe *)secp256k1_ellswift_prng;
  secp256k1_modinv64_update_fg_62_var_cold_7();
  psVar17 = &sStack_270;
  psStack_208 = psVar13;
  psStack_200 = psVar27;
  psStack_1f8 = psVar25;
  for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
    *(uint64_t *)psVar17->s = psVar15->n[0];
    psVar15 = (secp256k1_fe *)((long)psVar15 + (ulong)bVar31 * -0x10 + 8);
    psVar17 = (secp256k1_sha256 *)((long)psVar17 + (ulong)bVar31 * -0x10 + 8);
  }
  uVar5 = sStack_270.bytes >> 6;
  psStack_280 = (secp256k1_sha256 *)0x11ab12;
  secp256k1_sha256_write(&sStack_270,auStack_274,4);
  psStack_280 = (secp256k1_sha256 *)0x11ab1d;
  psVar17 = &sStack_270;
  secp256k1_sha256_finalize(&sStack_270,(uchar *)a);
  if (sStack_270.bytes >> 6 != uVar5 + 1) {
    psStack_280 = (secp256k1_sha256 *)secp256k1_ge_x_on_curve_var;
    secp256k1_ellswift_prng_cold_1();
    psStack_288 = a;
    psStack_280 = &sStack_270;
    secp256k1_fe_sqr(&sStack_2b8,(secp256k1_fe *)psVar17);
    secp256k1_fe_mul(&sStack_2b8,&sStack_2b8,(secp256k1_fe *)psVar17);
    secp256k1_fe_verify(&sStack_2b8);
    sStack_2b8.n[0] = sStack_2b8.n[0] + 2;
    sStack_2b8.magnitude = sStack_2b8.magnitude + 1;
    sStack_2b8.normalized = 0;
    secp256k1_fe_verify(&sStack_2b8);
    secp256k1_fe_is_square_var(&sStack_2b8);
    return;
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_inv_var(secp256k1_fe *r, const secp256k1_fe *x) {
    int input_is_zero = secp256k1_fe_normalizes_to_zero(x);
    SECP256K1_FE_VERIFY(x);

    secp256k1_fe_impl_inv_var(r, x);
    r->magnitude = x->magnitude > 0;
    r->normalized = 1;

    VERIFY_CHECK(secp256k1_fe_normalizes_to_zero(r) == input_is_zero);
    SECP256K1_FE_VERIFY(r);
}